

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_surjectionproof_verify
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,
              secp256k1_generator *ephemeral_input_tags,size_t n_ephemeral_input_tags,
              secp256k1_generator *ephemeral_output_tag)

{
  int iVar1;
  secp256k1_gej *r;
  long lVar2;
  uchar *b32;
  ulong uVar3;
  ulong uVar4;
  secp256k1_generator *a;
  secp256k1_ge *r_00;
  size_t i;
  ulong uVar5;
  size_t rsizes [1];
  uchar pk_ser [33];
  int overflow;
  uint32_t uStack_a0c4;
  uint32_t auStack_a0c0 [22];
  uint64_t local_a068;
  uchar msg32 [32];
  secp256k1_scalar borromean_s [256];
  secp256k1_gej ring_pubkeys [256];
  
  if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_surjectionproof_verify_cold_3();
  }
  else if (ephemeral_input_tags == (secp256k1_generator *)0x0) {
    secp256k1_surjectionproof_verify_cold_2();
  }
  else {
    if (ephemeral_output_tag != (secp256k1_generator *)0x0) {
      uVar5 = proof->n_inputs;
      if (uVar5 + 7 < 8) {
        uVar3 = 0;
      }
      else {
        uVar4 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 + (((uint)proof->used_inputs[uVar4] * 0x8040201 >> 3 & 0x11111111) *
                           0x11111111 >> 0x1c);
          uVar4 = uVar4 + 1;
        } while (uVar5 + 7 >> 3 != uVar4);
      }
      if (0x100 < uVar3) {
        return 0;
      }
      if (uVar5 != n_ephemeral_input_tags) {
        return 0;
      }
      if (uVar3 - 1 < uVar5) {
        r_00 = (secp256k1_ge *)borromean_s;
        lVar2 = 0;
        uVar5 = 0;
        a = ephemeral_input_tags;
        do {
          if ((proof->used_inputs[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) {
            secp256k1_fe_set_b32((secp256k1_fe *)r_00,a->data);
            secp256k1_fe_set_b32((secp256k1_fe *)(borromean_s[1].d + 1),a->data + 0x20);
            borromean_s[2].d[2]._0_4_ = 0;
            secp256k1_ge_neg(r_00,r_00);
            r = ring_pubkeys + lVar2;
            ring_pubkeys[lVar2].infinity = (int)borromean_s[2].d[2];
            (r->x).n[0] = borromean_s[0].d[0];
            ring_pubkeys[lVar2].x.n[1] = borromean_s[0].d[1];
            ring_pubkeys[lVar2].x.n[2] = borromean_s[0].d[2];
            ring_pubkeys[lVar2].x.n[3] = borromean_s[0].d[3];
            ring_pubkeys[lVar2].x.n[4] = borromean_s[1].d[0];
            ring_pubkeys[lVar2].y.n[0] = borromean_s[1].d[1];
            ring_pubkeys[lVar2].y.n[1] = borromean_s[1].d[2];
            ring_pubkeys[lVar2].y.n[2] = borromean_s[1].d[3];
            ring_pubkeys[lVar2].y.n[3] = borromean_s[2].d[0];
            ring_pubkeys[lVar2].y.n[4] = borromean_s[2].d[1];
            ring_pubkeys[lVar2].z.n[0] = 1;
            ring_pubkeys[lVar2].z.n[3] = 0;
            ring_pubkeys[lVar2].z.n[4] = 0;
            ring_pubkeys[lVar2].z.n[1] = 0;
            ring_pubkeys[lVar2].z.n[2] = 0;
            secp256k1_fe_set_b32((secp256k1_fe *)r_00,ephemeral_output_tag->data);
            secp256k1_fe_set_b32
                      ((secp256k1_fe *)(borromean_s[1].d + 1),ephemeral_output_tag->data + 0x20);
            borromean_s[2].d[2]._0_4_ = 0;
            secp256k1_gej_add_ge_var(r,r,r_00,(secp256k1_fe *)0x0);
            lVar2 = lVar2 + 1;
          }
          uVar5 = uVar5 + 1;
          a = a + 1;
        } while (n_ephemeral_input_tags != uVar5);
        rsizes[0] = uVar3;
        if (uVar3 != 0) {
          b32 = proof->data;
          do {
            b32 = b32 + 0x20;
            _overflow = _overflow & 0xffffffff00000000;
            secp256k1_scalar_set_b32((secp256k1_scalar *)r_00,b32,&overflow);
            if (overflow == 1) {
              return 0;
            }
            r_00 = (secp256k1_ge *)((r_00->x).n + 4);
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
        }
        overflow = 0x6a09e667;
        uStack_a0c4 = 0xbb67ae85;
        auStack_a0c0[0] = 0x3c6ef372;
        auStack_a0c0[1] = 0xa54ff53a;
        auStack_a0c0[2] = 0x510e527f;
        auStack_a0c0[3] = 0x9b05688c;
        auStack_a0c0[4] = 0x1f83d9ab;
        auStack_a0c0[5] = 0x5be0cd19;
        local_a068 = 0;
        do {
          pk_ser[0] = ephemeral_input_tags->data[0x3f] & 1 | 2;
          pk_ser._1_8_ = *(undefined8 *)ephemeral_input_tags->data;
          pk_ser._9_8_ = *(undefined8 *)(ephemeral_input_tags->data + 8);
          pk_ser._17_8_ = *(undefined8 *)(ephemeral_input_tags->data + 0x10);
          pk_ser._25_8_ = *(undefined8 *)(ephemeral_input_tags->data + 0x18);
          secp256k1_sha256_write((secp256k1_sha256 *)&overflow,pk_ser,0x21);
          ephemeral_input_tags = ephemeral_input_tags + 1;
          n_ephemeral_input_tags = n_ephemeral_input_tags - 1;
        } while (n_ephemeral_input_tags != 0);
        pk_ser[0] = ephemeral_output_tag->data[0x3f] & 1 | 2;
        pk_ser._1_8_ = *(undefined8 *)ephemeral_output_tag->data;
        pk_ser._9_8_ = *(undefined8 *)(ephemeral_output_tag->data + 8);
        pk_ser._17_8_ = *(undefined8 *)(ephemeral_output_tag->data + 0x10);
        pk_ser._25_8_ = *(undefined8 *)(ephemeral_output_tag->data + 0x18);
        secp256k1_sha256_write((secp256k1_sha256 *)&overflow,pk_ser,0x21);
        secp256k1_sha256_finalize((secp256k1_sha256 *)&overflow,msg32);
        iVar1 = secp256k1_borromean_verify
                          ((secp256k1_scalar *)0x0,proof->data,borromean_s,ring_pubkeys,rsizes,1,
                           msg32,0x20);
        return iVar1;
      }
      return 0;
    }
    secp256k1_surjectionproof_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_surjectionproof_verify(const secp256k1_context* ctx, const secp256k1_surjectionproof* proof, const secp256k1_generator* ephemeral_input_tags, size_t n_ephemeral_input_tags, const secp256k1_generator* ephemeral_output_tag) {
    size_t rsizes[1];    /* array needed for borromean sig API */
    size_t i;
    size_t n_total_pubkeys;
    size_t n_used_pubkeys;
    secp256k1_gej ring_pubkeys[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    secp256k1_scalar borromean_s[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    unsigned char msg32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(ephemeral_input_tags != NULL);
    ARG_CHECK(ephemeral_output_tag != NULL);

    /* Compute public keys */
    n_total_pubkeys = secp256k1_surjectionproof_n_total_inputs(ctx, proof);
    n_used_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx, proof);
    if (n_used_pubkeys == 0 || n_used_pubkeys > n_total_pubkeys || n_total_pubkeys != n_ephemeral_input_tags) {
        return 0;
    }

    /* Reject proofs with too many used inputs in USE_REDUCED_SURJECTION_PROOF_SIZE mode */
    if (n_used_pubkeys > SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS) {
        return 0;
    }

    if (secp256k1_surjection_compute_public_keys(ring_pubkeys, n_used_pubkeys, ephemeral_input_tags, n_total_pubkeys, proof->used_inputs, ephemeral_output_tag, 0, NULL) == 0) {
        return 0;
    }

    /* Verify signature */
    rsizes[0] = (int) n_used_pubkeys;
    for (i = 0; i < n_used_pubkeys; i++) {
        int overflow = 0;
        secp256k1_scalar_set_b32(&borromean_s[i], &proof->data[32 + 32 * i], &overflow);
        if (overflow == 1) {
            return 0;
        }
    }
    secp256k1_surjection_genmessage(msg32, ephemeral_input_tags, n_total_pubkeys, ephemeral_output_tag);
    return secp256k1_borromean_verify(NULL, &proof->data[0], borromean_s, ring_pubkeys, rsizes, 1, msg32, 32);
}